

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Vec_Int_t * Saig_RefManRefineWithSat(Saig_RefMan_t *p,Vec_Int_t *vAigPis)

{
  Vec_Ptr_t *p_00;
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vVar2PiId;
  Vec_Int_t *vAssumps;
  void *pvVar6;
  Vec_Vec_t *p_02;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint i;
  Vec_Vec_t *vLits;
  
  iVar11 = 0;
  p_01 = Cnf_DeriveSimple(p->pFrames,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_01);
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = Vec_IntStart(p->pAig->nTruePis);
    iVar10 = 1;
    for (; iVar11 < vAigPis->nSize; iVar11 = iVar11 + 1) {
      iVar2 = Vec_IntEntry(vAigPis,iVar11);
      if ((iVar2 < 0) || (p->pAig->nObjs[2] <= iVar2)) {
        __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x2d9,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      Vec_IntWriteEntry(pVVar5,iVar2,1);
    }
    vVar2PiId = Vec_IntStartFull(p_01->nVars);
    vAssumps = Vec_IntAlloc(p->pFrames->nObjs[2]);
    iVar11 = 0;
    while( true ) {
      p_00 = p->pFrames->vCis;
      if (p_00->nSize <= iVar11) break;
      pvVar6 = Vec_PtrEntry(p_00,iVar11);
      iVar2 = Vec_IntEntry(p->vMapPiF2A,iVar10 + -1);
      iVar3 = Vec_IntEntry(p->vMapPiF2A,iVar10);
      iVar4 = Vec_IntEntry(pVVar5,iVar2);
      if (iVar4 != 0) {
        pAVar1 = p->pCex;
        uVar8 = iVar2 + pAVar1->nRegs + iVar3 * pAVar1->nPis;
        Vec_IntPush(vAssumps,(uint)(((uint)(&pAVar1[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1)
                                   == 0) + p_01->pVarNums[*(int *)((long)pvVar6 + 0x24)] * 2);
        Vec_IntWriteEntry(vVar2PiId,p_01->pVarNums[*(int *)((long)pvVar6 + 0x24)],iVar11);
      }
      iVar11 = iVar11 + 1;
      iVar10 = iVar10 + 2;
    }
    Vec_IntFree(pVVar5);
    uVar8 = vAssumps->nSize;
    iVar11 = sat_solver_solve(s,vAssumps->pArray,vAssumps->pArray + (int)uVar8,1000000,0,0,0);
    pcVar7 = "SAT";
    if (iVar11 == -1) {
      pcVar7 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar8,pcVar7,
           (ulong)(uint)(s->stats).conflicts);
    p_02 = Saig_RefManOrderLiterals(p,vVar2PiId,vAssumps);
    vLits = p_02;
    for (iVar11 = 0; iVar11 < p_02->nSize; iVar11 = iVar11 + 1) {
      pVVar5 = Vec_VecEntryInt(p_02,iVar11);
      printf("%d ",(ulong)(uint)pVVar5->nSize);
    }
    putchar(10);
    for (iVar11 = 0; iVar10 = p_02->nSize, iVar11 < iVar10; iVar11 = iVar11 + 1) {
      vAssumps->nSize = 0;
      for (iVar2 = 0; iVar2 < iVar10; iVar2 = iVar2 + 1) {
        iVar10 = 0;
        while( true ) {
          pVVar5 = Vec_VecEntryInt(p_02,iVar2);
          if (pVVar5->nSize <= iVar10) break;
          pVVar5 = Vec_VecEntryInt(p_02,iVar2);
          iVar3 = Vec_IntEntry(pVVar5,iVar10);
          if (iVar2 != iVar11) {
            Vec_IntPush(vAssumps,iVar3);
          }
          iVar10 = iVar10 + 1;
        }
        iVar10 = p_02->nSize;
      }
      uVar8 = vAssumps->nSize;
      iVar10 = sat_solver_solve(s,vAssumps->pArray,vAssumps->pArray + (int)uVar8,1000000,0,0,0);
      pcVar7 = "SAT";
      if (iVar10 == -1) {
        pcVar7 = "UNSAT";
      }
      printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar8,pcVar7,
             (ulong)(uint)(s->stats).conflicts);
      if (iVar10 == -1) {
        pVVar5 = Vec_VecEntryInt(p_02,iVar11);
        pVVar5->nSize = 0;
      }
    }
    for (iVar11 = 0; iVar11 < iVar10; iVar11 = iVar11 + 1) {
      pVVar5 = Vec_VecEntryInt(p_02,iVar11);
      printf("%d ",(ulong)(uint)pVVar5->nSize);
      iVar10 = p_02->nSize;
    }
    putchar(10);
    vAssumps->nSize = 0;
    for (iVar11 = 0; iVar11 < p_02->nSize; iVar11 = iVar11 + 1) {
      iVar10 = 0;
      while( true ) {
        pVVar5 = Vec_VecEntryInt(p_02,iVar11);
        if (pVVar5->nSize <= iVar10) break;
        pVVar5 = Vec_VecEntryInt(p_02,iVar11);
        iVar2 = Vec_IntEntry(pVVar5,iVar10);
        Vec_IntPush(vAssumps,iVar2);
        iVar10 = iVar10 + 1;
      }
    }
    uVar8 = vAssumps->nSize;
    iVar11 = sat_solver_solve(s,vAssumps->pArray,vAssumps->pArray + (int)uVar8,1000000,0,0,0);
    pcVar7 = "SAT";
    if (iVar11 == -1) {
      pcVar7 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar8,pcVar7,
           (ulong)(uint)(s->stats).conflicts);
    pVVar5 = Vec_IntAlloc(100);
    uVar9 = 0;
    i = 0;
    if (0 < (int)uVar8) {
      uVar9 = uVar8;
      i = 0;
    }
    for (; uVar9 != i; i = i + 1) {
      iVar11 = Vec_IntEntry(vAssumps,i);
      iVar11 = Vec_IntEntry(vVar2PiId,iVar11 >> 1);
      if ((iVar11 < 0) || (p->pFrames->nObjs[2] <= iVar11)) {
        __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x347,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      Vec_IntPush(pVVar5,iVar11);
    }
    Cnf_DataFree(p_01);
    sat_solver_delete(s);
    Vec_IntFree(vAssumps);
    Vec_IntFree(vVar2PiId);
    Vec_VecFreeP(&vLits);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Saig_RefManRefineWithSat( Saig_RefMan_t * p, Vec_Int_t * vAigPis )
{
    int nConfLimit = 1000000;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits;
    Vec_Int_t * vReasons, * vAssumps, * vVisited, * vVar2PiId;
    int i, k, f, Entry, RetValue, Counter;

    // create CNF and SAT solver
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }

    // mark used AIG inputs
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAigPis, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pAig) );
        Vec_IntWriteEntry( vVisited, Entry, 1 );
    }

    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            continue;
        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }
    Vec_IntFree( vVisited );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

/*
    // AnalizeFinal does not work because it implications propagate directly
    // and SAT solver does not kick in (the number of conflicts in 0).

    // count the number of lits in the unsat core
    {
        int nCoreLits, * pCoreLits;
        nCoreLits = sat_solver_final( pSat, &pCoreLits );
        assert( nCoreLits > 0 );

        // count the number of flops
        vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
        for ( i = 0; i < nCoreLits; i++ )
        {
            int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(pCoreLits[i]) );
            int iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
            int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
            Vec_IntWriteEntry( vVisited, iInput, 1 );
        }
        // count the number of entries
        Counter = 0;
        Vec_IntForEachEntry( vVisited, Entry, i )
            Counter += Entry;
        Vec_IntFree( vVisited );

//        if ( p->fVerbose )
        printf( "AnalizeFinal: Assumptions %d (out of %d). Essential PIs = %d. Conflicts = %d.\n", 
            nCoreLits, Vec_IntSize(vAssumps), Counter, (int)pSat->stats.conflicts );
    }
*/

    // derive literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create assumptions
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

//    if ( p->fVerbose )
//        printf( "Total PIs = %d. Essential PIs = %d.\n", 
//            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );


    // transform assumptions into reasons
    vReasons = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        Vec_IntPush( vReasons, iPiNum );
    }

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    return vReasons;
}